

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O2

void __thiscall
cubeb_mixer::copy_and_trunc<float>
          (cubeb_mixer *this,size_t frames,float *input_buffer,float *output_buffer)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t i;
  ulong uVar5;
  
  uVar3 = (this->_context)._in_ch_count;
  uVar2 = (this->_context)._out_ch_count;
  uVar4 = (ulong)uVar2;
  if (uVar2 < uVar3) {
    for (uVar5 = 0; uVar5 < frames; uVar5 = (ulong)((int)uVar5 + 1)) {
      memcpy(output_buffer,input_buffer,uVar4 << 2);
      uVar4 = (ulong)(this->_context)._out_ch_count;
      output_buffer = output_buffer + uVar4;
      input_buffer = input_buffer + (this->_context)._in_ch_count;
    }
  }
  else if (uVar3 == 1 && 1 < uVar2) {
    for (uVar5 = 0; (uVar5 & 0xffffffff) < frames; uVar5 = uVar5 + 1) {
      fVar1 = input_buffer[uVar5];
      output_buffer[1] = fVar1;
      *output_buffer = fVar1;
      memset(output_buffer + 2,0,(ulong)((int)uVar4 - 2) << 2);
      uVar4 = (ulong)(this->_context)._out_ch_count;
      output_buffer = output_buffer + uVar4;
    }
  }
  else {
    for (uVar4 = 0; uVar4 < frames; uVar4 = (ulong)((int)uVar4 + 1)) {
      memcpy(output_buffer,input_buffer,(ulong)uVar3 << 2);
      uVar2 = (this->_context)._in_ch_count;
      input_buffer = input_buffer + uVar2;
      memset(output_buffer + uVar2,0,(ulong)((this->_context)._out_ch_count - uVar2) << 2);
      uVar3 = (this->_context)._in_ch_count;
      output_buffer = output_buffer + uVar2 + ((this->_context)._out_ch_count - uVar3);
    }
  }
  return;
}

Assistant:

void copy_and_trunc(size_t frames,
                      const T * input_buffer,
                      T * output_buffer) const
  {
    if (_context._in_ch_count <= _context._out_ch_count) {
      // Not enough channels to copy, fill the gaps with silence.
      if (_context._in_ch_count == 1 && _context._out_ch_count >= 2) {
        // Special case for upmixing mono input to stereo and more. We will
        // duplicate the mono channel to the first two channels. On most system,
        // the first two channels are for left and right. It is commonly
        // expected that mono will on both left+right channels
        for (uint32_t i = 0; i < frames; i++) {
          output_buffer[0] = output_buffer[1] = *input_buffer;
          PodZero(output_buffer + 2, _context._out_ch_count - 2);
          output_buffer += _context._out_ch_count;
          input_buffer++;
        }
        return;
      }
      for (uint32_t i = 0; i < frames; i++) {
        PodCopy(output_buffer, input_buffer, _context._in_ch_count);
        output_buffer += _context._in_ch_count;
        input_buffer += _context._in_ch_count;
        PodZero(output_buffer, _context._out_ch_count - _context._in_ch_count);
        output_buffer += _context._out_ch_count - _context._in_ch_count;
      }
    } else {
      for (uint32_t i = 0; i < frames; i++) {
        PodCopy(output_buffer, input_buffer, _context._out_ch_count);
        output_buffer += _context._out_ch_count;
        input_buffer += _context._in_ch_count;
      }
    }
  }